

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

void __thiscall sznet::LogStream::_formatInteger<unsigned_long>(LogStream *this,unsigned_long v)

{
  char *buf;
  size_t sVar1;
  char **ppcVar2;
  
  buf = (this->m_buffer).m_cur;
  ppcVar2 = &(this->m_buffer).m_cur;
  if (0x1f < (int)ppcVar2 - (int)buf) {
    sVar1 = detail::convert<unsigned_long>(buf,v);
    *ppcVar2 = *ppcVar2 + sVar1;
  }
  return;
}

Assistant:

void LogStream::_formatInteger(T v)
{
	if (m_buffer.avail() >= kMaxNumericSize)
	{
		size_t len = detail::convert(m_buffer.current(), v);
		m_buffer.add(len);
	}
}